

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_adpcm.cpp
# Opt level: O2

clock_t __thiscall ymfm::adpcm_b_channel::clock(adpcm_b_channel *this)

{
  uint uVar1;
  
  uVar1 = this->m_status & 0xfffffffb;
  this->m_status = uVar1;
  return (ulong)uVar1;
}

Assistant:

void adpcm_b_channel::clock()
{
	// only process if active and not recording (which we don't support)
	if (!m_regs.execute() || m_regs.record() || (m_status & STATUS_PLAYING) == 0)
	{
		m_status &= ~STATUS_PLAYING;
		return;
	}

	// otherwise, advance the step
	uint32_t position = m_position + m_regs.delta_n();
	m_position = uint16_t(position);
	if (position < 0x10000)
		return;

	// if we're about to process nibble 0, fetch sample
	if (m_curnibble == 0)
	{
		// playing from RAM/ROM
		if (m_regs.external())
			m_curbyte = m_owner.intf().ymfm_external_read(ACCESS_ADPCM_B, m_curaddress);
	}

	// extract the nibble from our current byte
	uint8_t data = uint8_t(m_curbyte << (4 * m_curnibble)) >> 4;
	m_curnibble ^= 1;

	// we just processed the last nibble
	if (m_curnibble == 0)
	{
		// if playing from RAM/ROM, check the end/limit address or advance
		if (m_regs.external())
		{
			// handle the sample end, either repeating or stopping
			if (at_end())
			{
				// if repeating, go back to the start
				if (m_regs.repeat())
					load_start();

				// otherwise, done; set the EOS bit
				else
				{
					m_accumulator = 0;
					m_prev_accum = 0;
					m_status = (m_status & ~STATUS_PLAYING) | STATUS_EOS;
					debug::log_keyon("%s\n", "ADPCM EOS");
					return;
				}
			}

			// wrap at the limit address
			else if (at_limit())
				m_curaddress = 0;

			// otherwise, advance the current address
			else
			{
				m_curaddress++;
				m_curaddress &= 0xffffff;
			}
		}

		// if CPU-driven, copy the next byte and request more
		else
		{
			m_curbyte = m_regs.cpudata();
			m_status |= STATUS_BRDY;
		}
	}

	// remember previous value for interpolation
	m_prev_accum = m_accumulator;

	// forecast to next forecast: 1/8, 3/8, 5/8, 7/8, 9/8, 11/8, 13/8, 15/8
	int32_t delta = (2 * bitfield(data, 0, 3) + 1) * m_adpcm_step / 8;
	if (bitfield(data, 3))
		delta = -delta;

	// add and clamp to 16 bits
	m_accumulator = clamp(m_accumulator + delta, -32768, 32767);

	// scale the ADPCM step: 0.9, 0.9, 0.9, 0.9, 1.2, 1.6, 2.0, 2.4
	static uint8_t const s_step_scale[8] = { 57, 57, 57, 57, 77, 102, 128, 153 };
	m_adpcm_step = clamp((m_adpcm_step * s_step_scale[bitfield(data, 0, 3)]) / 64, STEP_MIN, STEP_MAX);
}